

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Image.c
# Opt level: O1

Vec_Ptr_t *
Llb_ImgSupports(Aig_Man_t *p,Vec_Ptr_t *vDdMans,Vec_Int_t *vStart,Vec_Int_t *vStop,int fAddPis,
               int fVerbose)

{
  int iVar1;
  DdHalfWord DVar2;
  uint uVar3;
  int *piVar4;
  DdManager *dd;
  int iVar5;
  Vec_Ptr_t *pVVar6;
  void **ppvVar7;
  int *piVar8;
  void *pvVar9;
  DdNode *n;
  DdNode *pDVar10;
  Vec_Ptr_t *pVVar11;
  ulong uVar12;
  int iVar13;
  uint uVar14;
  long lVar15;
  size_t __n;
  long lVar16;
  char *__format;
  int iVar17;
  DdNode *pDVar18;
  ulong uVar19;
  
  if (vDdMans->nSize < 1) {
LAB_007d5712:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  iVar5 = Cudd_ReadSize((DdManager *)*vDdMans->pArray);
  pVVar6 = (Vec_Ptr_t *)malloc(0x10);
  pVVar6->nCap = 100;
  pVVar6->nSize = 0;
  ppvVar7 = (void **)malloc(800);
  pVVar6->pArray = ppvVar7;
  piVar8 = (int *)malloc(0x10);
  iVar13 = 0x10;
  if (0xe < iVar5 - 1U) {
    iVar13 = iVar5;
  }
  piVar8[1] = 0;
  *piVar8 = iVar13;
  lVar15 = (long)iVar13;
  if (iVar13 == 0) {
    pvVar9 = (void *)0x0;
  }
  else {
    pvVar9 = malloc(lVar15 * 4);
  }
  *(void **)(piVar8 + 2) = pvVar9;
  piVar8[1] = iVar5;
  __n = (long)iVar5 << 2;
  memset(pvVar9,0,__n);
  iVar17 = vStart->nSize;
  if (0 < (long)iVar17) {
    piVar4 = vStart->pArray;
    lVar16 = 0;
    do {
      iVar1 = piVar4[lVar16];
      if (((long)iVar1 < 0) || (piVar8[1] <= iVar1)) goto LAB_007d56d4;
      *(undefined4 *)((long)pvVar9 + (long)iVar1 * 4) = 1;
      lVar16 = lVar16 + 1;
    } while (iVar17 != lVar16);
  }
  if (pVVar6->nCap == 0) {
    if (ppvVar7 == (void **)0x0) {
      ppvVar7 = (void **)malloc(0x80);
    }
    else {
      ppvVar7 = (void **)realloc(ppvVar7,0x80);
    }
    pVVar6->pArray = ppvVar7;
    pVVar6->nCap = 0x10;
  }
  pVVar6->nSize = 1;
  *pVVar6->pArray = piVar8;
  if (0 < vDdMans->nSize) {
    lVar16 = 0;
    do {
      dd = (DdManager *)vDdMans->pArray[lVar16];
      piVar8 = (int *)malloc(0x10);
      piVar8[1] = 0;
      *piVar8 = iVar13;
      if (iVar13 == 0) {
        pvVar9 = (void *)0x0;
      }
      else {
        pvVar9 = malloc(lVar15 * 4);
      }
      *(void **)(piVar8 + 2) = pvVar9;
      piVar8[1] = iVar5;
      memset(pvVar9,0,__n);
      n = Cudd_Support(dd,dd->bFunc);
      Cudd_Ref(n);
      pDVar10 = Cudd_ReadOne(dd);
      pDVar18 = n;
      if (n != pDVar10) {
        do {
          DVar2 = pDVar18->index;
          if (((long)(int)DVar2 < 0) || (piVar8[1] <= (int)DVar2)) goto LAB_007d56d4;
          *(undefined4 *)(*(long *)(piVar8 + 2) + (long)(int)DVar2 * 4) = 1;
          pDVar18 = (pDVar18->type).kids.T;
          pDVar10 = Cudd_ReadOne(dd);
        } while (pDVar18 != pDVar10);
      }
      Cudd_RecursiveDeref(dd,n);
      uVar3 = pVVar6->nSize;
      uVar14 = pVVar6->nCap;
      if (uVar3 == uVar14) {
        if ((int)uVar14 < 0x10) {
          if (pVVar6->pArray == (void **)0x0) {
            ppvVar7 = (void **)malloc(0x80);
          }
          else {
            ppvVar7 = (void **)realloc(pVVar6->pArray,0x80);
          }
          iVar17 = 0x10;
        }
        else {
          iVar17 = uVar14 * 2;
          if (iVar17 <= (int)uVar14) goto LAB_007d53ce;
          if (pVVar6->pArray == (void **)0x0) {
            ppvVar7 = (void **)malloc((ulong)uVar14 << 4);
          }
          else {
            ppvVar7 = (void **)realloc(pVVar6->pArray,(ulong)uVar14 << 4);
          }
        }
        pVVar6->pArray = ppvVar7;
        pVVar6->nCap = iVar17;
      }
LAB_007d53ce:
      pVVar6->nSize = uVar3 + 1;
      pVVar6->pArray[(int)uVar3] = piVar8;
      lVar16 = lVar16 + 1;
    } while (lVar16 < vDdMans->nSize);
  }
  piVar8 = (int *)malloc(0x10);
  piVar8[1] = 0;
  *piVar8 = iVar13;
  if (iVar13 == 0) {
    pvVar9 = (void *)0x0;
  }
  else {
    pvVar9 = malloc(lVar15 << 2);
  }
  *(void **)(piVar8 + 2) = pvVar9;
  piVar8[1] = iVar5;
  memset(pvVar9,0,__n);
  iVar13 = vStop->nSize;
  if (0 < (long)iVar13) {
    piVar4 = vStop->pArray;
    lVar15 = 0;
    do {
      iVar17 = piVar4[lVar15];
      if (((long)iVar17 < 0) || (piVar8[1] <= iVar17)) goto LAB_007d56d4;
      *(undefined4 *)((long)pvVar9 + (long)iVar17 * 4) = 1;
      lVar15 = lVar15 + 1;
    } while (iVar13 != lVar15);
  }
  if ((fAddPis != 0) && (iVar13 = p->nTruePis, 0 < (long)iVar13)) {
    pVVar11 = p->vCis;
    lVar15 = 0;
    do {
      if (pVVar11->nSize <= lVar15) goto LAB_007d5712;
      iVar17 = *(int *)((long)pVVar11->pArray[lVar15] + 0x24);
      if (((long)iVar17 < 0) || (piVar8[1] <= iVar17)) {
LAB_007d56d4:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      *(undefined4 *)((long)pvVar9 + (long)iVar17 * 4) = 1;
      lVar15 = lVar15 + 1;
    } while (iVar13 != lVar15);
  }
  uVar3 = pVVar6->nSize;
  uVar14 = pVVar6->nCap;
  if (uVar3 == uVar14) {
    if ((int)uVar14 < 0x10) {
      if (pVVar6->pArray == (void **)0x0) {
        ppvVar7 = (void **)malloc(0x80);
      }
      else {
        ppvVar7 = (void **)realloc(pVVar6->pArray,0x80);
      }
      iVar13 = 0x10;
    }
    else {
      iVar13 = uVar14 * 2;
      if (iVar13 <= (int)uVar14) goto LAB_007d5546;
      if (pVVar6->pArray == (void **)0x0) {
        ppvVar7 = (void **)malloc((ulong)uVar14 << 4);
      }
      else {
        ppvVar7 = (void **)realloc(pVVar6->pArray,(ulong)uVar14 << 4);
      }
    }
    pVVar6->pArray = ppvVar7;
    pVVar6->nCap = iVar13;
  }
LAB_007d5546:
  ppvVar7 = pVVar6->pArray;
  pVVar6->nSize = uVar3 + 1;
  ppvVar7[(int)uVar3] = piVar8;
  if (iVar5 != p->vObjs->nSize) {
    __assert_fail("nSize == Aig_ManObjNumMax(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb2Image.c"
                  ,0x53,
                  "Vec_Ptr_t *Llb_ImgSupports(Aig_Man_t *, Vec_Ptr_t *, Vec_Int_t *, Vec_Int_t *, int, int)"
                 );
  }
  if ((fVerbose != 0) && (pVVar11 = p->vObjs, 0 < pVVar11->nSize)) {
    uVar19 = 0;
    do {
      piVar8 = (int *)pVVar11->pArray[uVar19];
      if ((piVar8 != (int *)0x0) && (-1 < (int)uVar3)) {
        uVar12 = 0;
        iVar13 = 0;
        do {
          if ((long)*(int *)((long)ppvVar7[uVar12] + 4) <= (long)uVar19) goto LAB_007d56f3;
          iVar13 = iVar13 + *(int *)(*(long *)((long)ppvVar7[uVar12] + 8) + uVar19 * 4);
          uVar12 = uVar12 + 1;
        } while (uVar3 + 1 != uVar12);
        if (iVar13 != 0) {
          printf("Obj = %4d : ",uVar19 & 0xffffffff);
          uVar14 = (uint)*(undefined8 *)(piVar8 + 6) & 7;
          if ((((uVar14 == 2) &&
               ((__format = "pi  ", *piVar8 < p->nTruePis ||
                (__format = "lo  ", p->nTruePis <= *piVar8)))) ||
              ((uVar14 == 3 && (__format = "li  ", p->nTruePos <= *piVar8)))) ||
             (__format = "and ", 0xfffffffd < ((uint)*(undefined8 *)(piVar8 + 6) & 7) - 7)) {
            printf(__format);
          }
          if (-1 < (int)uVar3) {
            uVar12 = 0;
            do {
              if ((long)*(int *)((long)ppvVar7[uVar12] + 4) <= (long)uVar19) {
LAB_007d56f3:
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                              ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
              }
              printf("%d",(ulong)*(uint *)(*(long *)((long)ppvVar7[uVar12] + 8) + uVar19 * 4));
              uVar12 = uVar12 + 1;
            } while (uVar3 + 1 != uVar12);
          }
          putchar(10);
        }
      }
      uVar19 = uVar19 + 1;
      pVVar11 = p->vObjs;
    } while ((long)uVar19 < (long)pVVar11->nSize);
  }
  return pVVar6;
}

Assistant:

Vec_Ptr_t * Llb_ImgSupports( Aig_Man_t * p, Vec_Ptr_t * vDdMans, Vec_Int_t * vStart, Vec_Int_t * vStop, int fAddPis, int fVerbose )
{
    Vec_Ptr_t * vSupps;
    Vec_Int_t * vOne;
    Aig_Obj_t * pObj;
    DdManager * dd;
    DdNode * bSupp, * bTemp;
    int i, Entry, nSize;
    nSize  = Cudd_ReadSize( (DdManager *)Vec_PtrEntry( vDdMans, 0 ) );
    vSupps = Vec_PtrAlloc( 100 );
    // create initial
    vOne = Vec_IntStart( nSize );
    Vec_IntForEachEntry( vStart, Entry, i )
        Vec_IntWriteEntry( vOne, Entry, 1 );
    Vec_PtrPush( vSupps, vOne );
    // create intermediate 
    Vec_PtrForEachEntry( DdManager *, vDdMans, dd, i )
    {
        vOne  = Vec_IntStart( nSize );
        bSupp = Cudd_Support( dd, dd->bFunc );  Cudd_Ref( bSupp );
        for ( bTemp = bSupp; bTemp != Cudd_ReadOne(dd); bTemp = cuddT(bTemp) )
            Vec_IntWriteEntry( vOne, bTemp->index, 1 );
        Cudd_RecursiveDeref( dd, bSupp );
        Vec_PtrPush( vSupps, vOne );
    }
    // create final
    vOne = Vec_IntStart( nSize );
    Vec_IntForEachEntry( vStop, Entry, i )
        Vec_IntWriteEntry( vOne, Entry, 1 );
    if ( fAddPis )
        Saig_ManForEachPi( p, pObj, i )
            Vec_IntWriteEntry( vOne, Aig_ObjId(pObj), 1 );
    Vec_PtrPush( vSupps, vOne );

    // print supports
    assert( nSize == Aig_ManObjNumMax(p) );
    if ( !fVerbose )
        return vSupps;
    Aig_ManForEachObj( p, pObj, i )
    {
        int k, Counter = 0;
        Vec_PtrForEachEntry( Vec_Int_t *, vSupps, vOne, k )
            Counter += Vec_IntEntry(vOne, i);
        if ( Counter == 0 ) 
            continue;
        printf( "Obj = %4d : ", i );
        if ( Saig_ObjIsPi(p,pObj) )
            printf( "pi  " );
        else if ( Saig_ObjIsLo(p,pObj) )
            printf( "lo  " );
        else if ( Saig_ObjIsLi(p,pObj) )
            printf( "li  " );
        else if ( Aig_ObjIsNode(pObj) )
            printf( "and " );
        Vec_PtrForEachEntry( Vec_Int_t *, vSupps, vOne, k )
            printf( "%d", Vec_IntEntry(vOne, i) );
        printf( "\n" );
    }
    return vSupps;
}